

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::program_binary(NegativeTestContext *ctx)

{
  ostringstream *poVar1;
  RenderContext *renderCtx;
  GLuint program;
  GLuint program_00;
  TestError *this;
  allocator<char> local_2c5;
  GLint bufSize;
  GLsizei binaryLength;
  GLint linkStatus;
  vector<unsigned_char,_std::allocator<unsigned_char>_> binaryBuf;
  GLenum binaryFormat;
  undefined1 local_270 [384];
  ShaderProgram srcProgram;
  
  renderCtx = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&binaryBuf,
             "#version 300 es\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n",
             (allocator<char> *)&binaryLength);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&binaryFormat,
             "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(0.0);\n}\n"
             ,(allocator<char> *)&bufSize);
  glu::makeVtxFragSources((ProgramSources *)local_270,(string *)&binaryBuf,(string *)&binaryFormat);
  glu::ShaderProgram::ShaderProgram(&srcProgram,renderCtx,(ProgramSources *)local_270);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_270);
  std::__cxx11::string::~string((string *)&binaryFormat);
  std::__cxx11::string::~string((string *)&binaryBuf);
  program = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  program_00 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  binaryFormat = 0xffffffff;
  binaryLength = -1;
  binaryBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  binaryBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  binaryBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bufSize = -1;
  linkStatus = -1;
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,srcProgram.m_program.m_program,0x8741,&bufSize);
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,srcProgram.m_program.m_program,0x8b82,&linkStatus);
  local_270._0_8_ = (ctx->super_CallLogWrapper).m_log;
  poVar1 = (ostringstream *)(local_270 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"// GL_PROGRAM_BINARY_LENGTH = ");
  std::ostream::operator<<(poVar1,bufSize);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_270,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_270._0_8_ = (ctx->super_CallLogWrapper).m_log;
  poVar1 = (ostringstream *)(local_270 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"// GL_LINK_STATUS = ");
  std::ostream::operator<<(poVar1,linkStatus);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_270,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  if (-1 < (long)bufSize) {
    if (bufSize != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&binaryBuf,(long)bufSize);
      glu::CallLogWrapper::glGetProgramBinary
                (&ctx->super_CallLogWrapper,srcProgram.m_program.m_program,bufSize,&binaryLength,
                 &binaryFormat,
                 binaryBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start);
      NegativeTestContext::expectError(ctx,0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_270,
                 "GL_INVALID_OPERATION is generated if program is not the name of an existing program object."
                 ,&local_2c5);
      NegativeTestContext::beginSection(ctx,(string *)local_270);
      std::__cxx11::string::~string((string *)local_270);
      glu::CallLogWrapper::glProgramBinary
                (&ctx->super_CallLogWrapper,program_00,binaryFormat,
                 binaryBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,binaryLength);
      NegativeTestContext::expectError(ctx,0x502);
      NegativeTestContext::endSection(ctx);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_270,
                 "GL_INVALID_ENUM is generated if binaryFormat is not a value recognized by the implementation."
                 ,&local_2c5);
      NegativeTestContext::beginSection(ctx,(string *)local_270);
      std::__cxx11::string::~string((string *)local_270);
      glu::CallLogWrapper::glProgramBinary
                (&ctx->super_CallLogWrapper,program,0xffffffff,
                 binaryBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,binaryLength);
      NegativeTestContext::expectError(ctx,0x500);
      NegativeTestContext::endSection(ctx);
    }
    glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,program_00);
    glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&binaryBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    glu::ShaderProgram::~ShaderProgram(&srcProgram);
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"bufSize >= 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeShaderApiTests.cpp"
             ,0x209);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void program_binary (NegativeTestContext& ctx)
{
	glu::ShaderProgram		srcProgram		(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));
	GLuint					dstProgram		= ctx.glCreateProgram();
	GLuint					dummyShader		= ctx.glCreateShader(GL_VERTEX_SHADER);
	GLenum					binaryFormat	= -1;
	GLsizei					binaryLength	= -1;
	std::vector<deUint8>	binaryBuf;
	GLint					bufSize			= -1;
	GLint					linkStatus		= -1;

	ctx.glGetProgramiv		(srcProgram.getProgram(), GL_PROGRAM_BINARY_LENGTH,	&bufSize);
	ctx.glGetProgramiv		(srcProgram.getProgram(), GL_LINK_STATUS,			&linkStatus);
	ctx.getLog() << TestLog::Message << "// GL_PROGRAM_BINARY_LENGTH = " << bufSize << TestLog::EndMessage;
	ctx.getLog() << TestLog::Message << "// GL_LINK_STATUS = " << linkStatus << TestLog::EndMessage;

	TCU_CHECK(bufSize >= 0);
	if (bufSize > 0)
	{
		binaryBuf.resize(bufSize);
		ctx.glGetProgramBinary	(srcProgram.getProgram(), bufSize, &binaryLength, &binaryFormat, &binaryBuf[0]);
		ctx.expectError			(GL_NO_ERROR);

		ctx.beginSection("GL_INVALID_OPERATION is generated if program is not the name of an existing program object.");
		ctx.glProgramBinary		(dummyShader, binaryFormat, &binaryBuf[0], binaryLength);
		ctx.expectError			(GL_INVALID_OPERATION);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_ENUM is generated if binaryFormat is not a value recognized by the implementation.");
		ctx.glProgramBinary		(dstProgram, -1, &binaryBuf[0], binaryLength);
		ctx.expectError			(GL_INVALID_ENUM);
		ctx.endSection();
	}

	ctx.glDeleteShader(dummyShader);
	ctx.glDeleteProgram(dstProgram);
}